

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O0

bool __thiscall Track::has_good_data(Track *this)

{
  bool bVar1;
  __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_38 [2];
  Sector *local_28;
  Sector *local_20;
  __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_18;
  __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> it;
  Track *this_local;
  
  it._M_current = (Sector *)this;
  local_20 = (Sector *)begin(this);
  local_28 = (Sector *)end(this);
  local_18 = std::
             find_if<__gnu_cxx::__normal_iterator<Sector_const*,std::vector<Sector,std::allocator<Sector>>>,Track::has_good_data()const::__0>
                       (local_20,local_28);
  local_38[0]._M_current = (Sector *)end(this);
  bVar1 = __gnu_cxx::operator==(&local_18,local_38);
  return bVar1;
}

Assistant:

bool Track::has_good_data() const
{
    auto it = std::find_if(begin(), end(), [](const Sector& sector) {
        if (sector.is_8k_sector() && sector.has_data())
        {
            const Data& data = sector.data_copy();
            if (!ChecksumMethods(data.data(), data.size()).empty())
                return false;
        }
        return !sector.has_good_data();
        });

    return it == end();
}